

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O0

int __thiscall CmdLineArgsParser::ParseInteger(CmdLineArgsParser *this)

{
  code *pcVar1;
  bool bVar2;
  char16 cVar3;
  Exception *pEVar4;
  undefined4 *puVar5;
  bool local_42;
  bool local_41;
  int local_2c;
  int local_28;
  int currentDigit;
  int base;
  int local_18;
  int local_14;
  int sign;
  int result;
  CmdLineArgsParser *this_local;
  
  local_14 = 0;
  local_18 = 1;
  cVar3 = CurChar(this);
  if (cVar3 == L'-') {
    local_18 = -1;
    NextChar(this);
  }
  bVar2 = IsDigit(this);
  if (!bVar2) {
    pEVar4 = (Exception *)__cxa_allocate_exception(8);
    Exception::Exception(pEVar4,L"Integer Expected");
    __cxa_throw(pEVar4,&Exception::typeinfo,0);
  }
  local_28 = 10;
  cVar3 = CurChar(this);
  if (cVar3 == L'0') {
    NextChar(this);
    cVar3 = CurChar(this);
    if (cVar3 == L'x') {
      NextChar(this);
      local_28 = 0x10;
    }
  }
  while( true ) {
    bVar2 = IsDigit(this);
    local_41 = true;
    if (!bVar2) {
      local_42 = false;
      if (local_28 == 0x10) {
        local_42 = IsHexDigit(this);
      }
      local_41 = local_42;
    }
    if (local_41 == false) {
      return local_14 * local_18;
    }
    cVar3 = CurChar(this);
    if (9 < (int)((ushort)cVar3 - 0x30)) {
      if (local_28 != 0x10) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/CmdParser.cpp"
                           ,0xc9,"(base == 16)","base == 16");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      cVar3 = CurChar(this);
      if ((ushort)cVar3 < 0x46) {
        cVar3 = CurChar(this);
        local_2c = (ushort)cVar3 - 0x37;
      }
      else {
        cVar3 = CurChar(this);
        local_2c = (ushort)cVar3 - 0x57;
      }
      if (0xf < local_2c) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/CmdParser.cpp"
                           ,0xd3,"(currentDigit < 16)","currentDigit < 16");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
    }
    cVar3 = CurChar(this);
    local_14 = local_14 * local_28 + ((ushort)cVar3 - 0x30);
    if (local_14 < 0) break;
    NextChar(this);
  }
  pEVar4 = (Exception *)__cxa_allocate_exception(8);
  Exception::Exception(pEVar4,L"Integer too large to parse");
  __cxa_throw(pEVar4,&Exception::typeinfo,0);
}

Assistant:

int
CmdLineArgsParser::ParseInteger()
{
    int result  = 0;
    int sign    = 1;

    if('-' == CurChar())
    {
        sign = -1;
        NextChar();
    }
    if(!IsDigit())
    {
        throw Exception(_u("Integer Expected"));
    }

    int base = 10;

    if ('0' == CurChar())
    {
        NextChar();
        if (CurChar() == 'x')
        {
            NextChar();
            base = 16;
        }
        // Should the else case be parse as octal?
    }

    while(IsDigit() || (base == 16 && IsHexDigit()))
    {
        int currentDigit = (int)(CurChar() - '0');
        if (currentDigit > 9)
        {
            Assert(base == 16);
            if (CurChar() < 'F')
            {
                currentDigit = 10 + (int)(CurChar() - 'A');
            }
            else
            {
                currentDigit = 10 + (int)(CurChar() - 'a');
            }

            Assert(currentDigit < 16);
        }

        result = result * base + (int)(CurChar() - '0');
        if(result < 0)
        {
            // overflow or underflow in case sign = -1
            throw Exception(_u("Integer too large to parse"));
        }

        NextChar();
    }

    return result * sign;
}